

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O0

long __thiscall internalJSONNode::operator_cast_to_long(internalJSONNode *this)

{
  uchar uVar1;
  internalJSONNode *this_local;
  
  Fetch(this);
  uVar1 = type(this);
  if (uVar1 == '\0') {
    this_local = (internalJSONNode *)0x0;
  }
  else {
    if (uVar1 == '\x01') {
      FetchNumber(this);
    }
    else if (uVar1 == '\x03') {
      return (long)(int)(uint)(((this->_value)._bool & 1U) != 0);
    }
    this_local = (internalJSONNode *)(long)(this->_value)._number;
  }
  return (long)this_local;
}

Assistant:

internalJSONNode::operator long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long)"));
		  JSON_ASSERT(_value._number > LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number < LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number == (json_number)((long)_value._number), json_string(JSON_TEXT("(long) will truncate ")) + _string);
		  return (long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long long)"));
		  #ifdef LONG_LONG_MAX			 
			 JSON_ASSERT(_value._number < LONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number < LLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #endif
		  #ifdef LONG_LONG_MIN
			 JSON_ASSERT(_value._number > LONG_LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number > LLONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #endif

		  JSON_ASSERT(_value._number == (json_number)((long long)_value._number), json_string(JSON_TEXT("(long long) will truncate ")) + _string);
		  return (long long)_value._number;
	   #endif /*<- */
    }